

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

void loader_destroy(void)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  
  plVar2 = (long *)plugin_manager_impl();
  if (plVar2[1] != 0) {
    lVar3 = thread_id_get_current();
    if (plVar2[2] != lVar3) {
      log_write_impl_va("metacall",0x33b,"loader_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,
                        "Destruction of the loaders is being executed from different thread of where MetaCall was initialized, this is very dangerous and it can generate memory leaks and deadlocks, I hope you know what are you doing..."
                       );
    }
    loader_unload_children((loader_impl)0x0);
    if (*plVar2 != 0) {
      iVar1 = plugin_manager_clear(&loader_manager);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x349,"loader_destroy",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,"Failed to clear host loader");
      }
      *plVar2 = 0;
    }
  }
  plugin_manager_destroy(&loader_manager);
  loader_manager_initialized = 0;
  return;
}

Assistant:

void loader_destroy(void)
{
	loader_manager_impl manager_impl = plugin_manager_impl_type(&loader_manager, loader_manager_impl);

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Begin to destroy all the loaders"); */

	/* Delete loaders in inverse order */
	if (manager_impl->initialization_order != NULL)
	{
		uint64_t current = thread_id_get_current();

		if (manager_impl->init_thread_id != current)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Destruction of the loaders is being executed "
												   "from different thread of where MetaCall was initialized, "
												   "this is very dangerous and it can generate memory leaks and deadlocks, "
												   "I hope you know what are you doing...");

			/* TODO: How to deal with this? */
		}

		loader_initialization_debug();

		loader_unload_children(NULL);

		/* The host is the first loader, it must be destroyed at the end */
		if (manager_impl->host != NULL)
		{
			if (plugin_manager_clear(&loader_manager, manager_impl->host) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Failed to clear host loader");
			}

			manager_impl->host = NULL;
		}
	}

	plugin_manager_destroy(&loader_manager);

	loader_manager_initialized = 1;
}